

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall doctest::Context::parseArgs(Context *this,int argc,char **argv,bool withDefaults)

{
  bool bVar1;
  uint uVar2;
  ContextState *pCVar3;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  String *this_00;
  int intRes;
  String strRes;
  uint local_4c;
  String local_48;
  String local_40;
  String local_38;
  
  detail::parseCommaSepArgs
            (argc,argv,"dt-source-file=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  detail::parseCommaSepArgs
            (argc,argv,"dt-sf=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  detail::parseCommaSepArgs
            (argc,argv,"dt-source-file-exclude=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1);
  detail::parseCommaSepArgs
            (argc,argv,"dt-sfe=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1);
  detail::parseCommaSepArgs
            (argc,argv,"dt-test-suite=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2);
  detail::parseCommaSepArgs
            (argc,argv,"dt-ts=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2);
  detail::parseCommaSepArgs
            (argc,argv,"dt-test-suite-exclude=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 3);
  detail::parseCommaSepArgs
            (argc,argv,"dt-tse=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 3);
  detail::parseCommaSepArgs
            (argc,argv,"dt-test-case=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 4);
  detail::parseCommaSepArgs
            (argc,argv,"dt-tc=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 4);
  detail::parseCommaSepArgs
            (argc,argv,"dt-test-case-exclude=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 5);
  detail::parseCommaSepArgs
            (argc,argv,"dt-tce=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 5);
  local_4c = 0;
  String::String(&local_48,"");
  String::String(&local_40,"file");
  bVar1 = detail::parseOption(argc,argv,"dt-order-by=",&local_48,&local_40);
  if (bVar1) {
    free(local_40.m_str);
    src = extraout_RDX;
LAB_00114ccc:
    this_00 = &this->p->order_by;
    if (this_00 != &local_48) {
      String::copy(this_00,(EVP_PKEY_CTX *)&local_48,src);
    }
  }
  else {
    String::String(&local_38,"file");
    bVar1 = detail::parseOption(argc,argv,"dt-ob=",&local_48,&local_38);
    free(local_38.m_str);
    free(local_40.m_str);
    src = extraout_RDX_00;
    if (bVar1 || withDefaults) goto LAB_00114ccc;
  }
  bVar1 = detail::parseIntOption(argc,argv,"dt-rand-seed=",option_int,(int *)&local_4c);
  uVar2 = local_4c;
  if (((bVar1) ||
      (bVar1 = detail::parseIntOption(argc,argv,"dt-rs=",option_int,(int *)&local_4c),
      uVar2 = local_4c, bVar1)) || (uVar2 = 0, withDefaults)) {
    this->p->rand_seed = uVar2;
  }
  bVar1 = detail::parseIntOption(argc,argv,"dt-first=",option_int,(int *)&local_4c);
  uVar2 = local_4c;
  if (bVar1) {
LAB_00114d7b:
    this->p->first = uVar2;
  }
  else {
    bVar1 = detail::parseIntOption(argc,argv,"dt-f=",option_int,(int *)&local_4c);
    uVar2 = local_4c;
    if ((bVar1) || (uVar2 = 1, withDefaults)) goto LAB_00114d7b;
  }
  bVar1 = detail::parseIntOption(argc,argv,"dt-last=",option_int,(int *)&local_4c);
  uVar2 = local_4c;
  if (((bVar1) ||
      (bVar1 = detail::parseIntOption(argc,argv,"dt-l=",option_int,(int *)&local_4c),
      uVar2 = local_4c, bVar1)) || (uVar2 = 0, withDefaults)) {
    this->p->last = uVar2;
  }
  bVar1 = detail::parseIntOption(argc,argv,"dt-abort-after=",option_int,(int *)&local_4c);
  uVar2 = local_4c;
  if (((bVar1) ||
      (bVar1 = detail::parseIntOption(argc,argv,"dt-aa=",option_int,(int *)&local_4c),
      uVar2 = local_4c, bVar1)) || (uVar2 = 0, withDefaults)) {
    this->p->abort_after = uVar2;
  }
  bVar1 = detail::parseIntOption(argc,argv,"dt-success=",option_bool,(int *)&local_4c);
  if ((bVar1) ||
     (bVar1 = detail::parseIntOption(argc,argv,"dt-s=",option_bool,(int *)&local_4c), bVar1)) {
    (this->p->super_TestAccessibleContextState).success = local_4c != 0;
  }
  else {
    bVar1 = detail::parseFlag(argc,argv,"dt-success");
    if ((bVar1) || (bVar1 = detail::parseFlag(argc,argv,"dt-s"), bVar1)) {
      (this->p->super_TestAccessibleContextState).success = true;
    }
    else if (withDefaults) {
      (this->p->super_TestAccessibleContextState).success = false;
    }
  }
  bVar1 = detail::parseIntOption(argc,argv,"dt-case-sensitive=",option_bool,(int *)&local_4c);
  if ((bVar1) ||
     (bVar1 = detail::parseIntOption(argc,argv,"dt-cs=",option_bool,(int *)&local_4c), bVar1)) {
    this->p->case_sensitive = local_4c != 0;
  }
  else {
    bVar1 = detail::parseFlag(argc,argv,"dt-case-sensitive");
    if ((bVar1) || (bVar1 = detail::parseFlag(argc,argv,"dt-cs"), bVar1)) {
      this->p->case_sensitive = true;
    }
    else if (withDefaults) {
      this->p->case_sensitive = false;
    }
  }
  bVar1 = detail::parseIntOption(argc,argv,"dt-exit=",option_bool,(int *)&local_4c);
  if ((bVar1) ||
     (bVar1 = detail::parseIntOption(argc,argv,"dt-e=",option_bool,(int *)&local_4c), bVar1)) {
    this->p->exit = local_4c != 0;
  }
  else {
    bVar1 = detail::parseFlag(argc,argv,"dt-exit");
    if ((bVar1) || (bVar1 = detail::parseFlag(argc,argv,"dt-e"), bVar1)) {
      this->p->exit = true;
    }
    else if (withDefaults) {
      this->p->exit = false;
    }
  }
  bVar1 = detail::parseIntOption(argc,argv,"dt-no-throw=",option_bool,(int *)&local_4c);
  if ((bVar1) ||
     (bVar1 = detail::parseIntOption(argc,argv,"dt-nt=",option_bool,(int *)&local_4c), bVar1)) {
    (this->p->super_TestAccessibleContextState).no_throw = local_4c != 0;
  }
  else {
    bVar1 = detail::parseFlag(argc,argv,"dt-no-throw");
    if ((bVar1) || (bVar1 = detail::parseFlag(argc,argv,"dt-nt"), bVar1)) {
      (this->p->super_TestAccessibleContextState).no_throw = true;
    }
    else if (withDefaults) {
      (this->p->super_TestAccessibleContextState).no_throw = false;
    }
  }
  bVar1 = detail::parseIntOption(argc,argv,"dt-no-exitcode=",option_bool,(int *)&local_4c);
  if ((bVar1) ||
     (bVar1 = detail::parseIntOption(argc,argv,"dt-ne=",option_bool,(int *)&local_4c), bVar1)) {
    this->p->no_exitcode = local_4c != 0;
  }
  else {
    bVar1 = detail::parseFlag(argc,argv,"dt-no-exitcode");
    if ((bVar1) || (bVar1 = detail::parseFlag(argc,argv,"dt-ne"), bVar1)) {
      this->p->no_exitcode = true;
    }
    else if (withDefaults) {
      this->p->no_exitcode = false;
    }
  }
  bVar1 = detail::parseIntOption(argc,argv,"dt-no-run=",option_bool,(int *)&local_4c);
  if ((bVar1) ||
     (bVar1 = detail::parseIntOption(argc,argv,"dt-nr=",option_bool,(int *)&local_4c), bVar1)) {
    this->p->no_run = local_4c != 0;
  }
  else {
    bVar1 = detail::parseFlag(argc,argv,"dt-no-run");
    if ((bVar1) || (bVar1 = detail::parseFlag(argc,argv,"dt-nr"), bVar1)) {
      this->p->no_run = true;
    }
    else if (withDefaults) {
      this->p->no_run = false;
    }
  }
  bVar1 = detail::parseIntOption(argc,argv,"dt-no-version=",option_bool,(int *)&local_4c);
  if ((bVar1) ||
     (bVar1 = detail::parseIntOption(argc,argv,"dt-nv=",option_bool,(int *)&local_4c), bVar1)) {
    this->p->no_version = local_4c != 0;
  }
  else {
    bVar1 = detail::parseFlag(argc,argv,"dt-no-version");
    if ((bVar1) || (bVar1 = detail::parseFlag(argc,argv,"dt-nv"), bVar1)) {
      this->p->no_version = true;
    }
    else if (withDefaults) {
      this->p->no_version = false;
    }
  }
  bVar1 = detail::parseIntOption(argc,argv,"dt-no-colors=",option_bool,(int *)&local_4c);
  if ((bVar1) ||
     (bVar1 = detail::parseIntOption(argc,argv,"dt-nc=",option_bool,(int *)&local_4c), bVar1)) {
    this->p->no_colors = local_4c != 0;
  }
  else {
    bVar1 = detail::parseFlag(argc,argv,"dt-no-colors");
    if ((bVar1) || (bVar1 = detail::parseFlag(argc,argv,"dt-nc"), bVar1)) {
      this->p->no_colors = true;
    }
    else if (withDefaults) {
      this->p->no_colors = false;
    }
  }
  bVar1 = detail::parseIntOption(argc,argv,"dt-no-breaks=",option_bool,(int *)&local_4c);
  if ((bVar1) ||
     (bVar1 = detail::parseIntOption(argc,argv,"dt-nb=",option_bool,(int *)&local_4c), bVar1)) {
    (this->p->super_TestAccessibleContextState).no_breaks = local_4c != 0;
  }
  else {
    bVar1 = detail::parseFlag(argc,argv,"dt-no-breaks");
    if ((bVar1) || (bVar1 = detail::parseFlag(argc,argv,"dt-nb"), bVar1)) {
      (this->p->super_TestAccessibleContextState).no_breaks = true;
    }
    else if (withDefaults) {
      (this->p->super_TestAccessibleContextState).no_breaks = false;
    }
  }
  bVar1 = detail::parseIntOption(argc,argv,"dt-no-path-filenames=",option_bool,(int *)&local_4c);
  if ((bVar1) ||
     (bVar1 = detail::parseIntOption(argc,argv,"dt-npf=",option_bool,(int *)&local_4c), bVar1)) {
    pCVar3 = this->p;
    pCVar3->no_path_in_filenames = local_4c != 0;
LAB_001150e9:
    if (!withDefaults) goto LAB_001150f9;
  }
  else {
    bVar1 = detail::parseFlag(argc,argv,"dt-no-path-filenames");
    if ((bVar1) || (bVar1 = detail::parseFlag(argc,argv,"dt-npf"), bVar1)) {
      pCVar3 = this->p;
      pCVar3->no_path_in_filenames = true;
      goto LAB_001150e9;
    }
    if (!withDefaults) goto LAB_001150f9;
    pCVar3 = this->p;
    pCVar3->no_path_in_filenames = false;
  }
  pCVar3->list_test_suites = false;
  pCVar3->help = false;
  pCVar3->version = false;
  pCVar3->count = false;
  pCVar3->list_test_cases = false;
LAB_001150f9:
  bVar1 = detail::parseFlag(argc,argv,"dt-help");
  if (((bVar1) || (bVar1 = detail::parseFlag(argc,argv,"dt-h"), bVar1)) ||
     (bVar1 = detail::parseFlag(argc,argv,"dt-?"), bVar1)) {
    pCVar3 = this->p;
    pCVar3->help = true;
    pCVar3->exit = true;
  }
  bVar1 = detail::parseFlag(argc,argv,"dt-version");
  if ((bVar1) || (bVar1 = detail::parseFlag(argc,argv,"dt-v"), bVar1)) {
    pCVar3 = this->p;
    pCVar3->version = true;
    pCVar3->exit = true;
  }
  bVar1 = detail::parseFlag(argc,argv,"dt-count");
  if ((bVar1) || (bVar1 = detail::parseFlag(argc,argv,"dt-c"), bVar1)) {
    pCVar3 = this->p;
    pCVar3->count = true;
    pCVar3->exit = true;
  }
  bVar1 = detail::parseFlag(argc,argv,"dt-list-test-cases");
  if ((bVar1) || (bVar1 = detail::parseFlag(argc,argv,"dt-ltc"), bVar1)) {
    pCVar3 = this->p;
    pCVar3->list_test_cases = true;
    pCVar3->exit = true;
  }
  bVar1 = detail::parseFlag(argc,argv,"dt-list-test-suites");
  if ((bVar1) || (bVar1 = detail::parseFlag(argc,argv,"dt-lts"), bVar1)) {
    pCVar3 = this->p;
    pCVar3->list_test_suites = true;
    pCVar3->exit = true;
  }
  free(local_48.m_str);
  return;
}

Assistant:

void Context::parseArgs(int argc, const char* const* argv, bool withDefaults) {
    using namespace detail;

    // clang-format off
    parseCommaSepArgs(argc, argv, "dt-source-file=",        p->filters[0]);
    parseCommaSepArgs(argc, argv, "dt-sf=",                 p->filters[0]);
    parseCommaSepArgs(argc, argv, "dt-source-file-exclude=",p->filters[1]);
    parseCommaSepArgs(argc, argv, "dt-sfe=",                p->filters[1]);
    parseCommaSepArgs(argc, argv, "dt-test-suite=",         p->filters[2]);
    parseCommaSepArgs(argc, argv, "dt-ts=",                 p->filters[2]);
    parseCommaSepArgs(argc, argv, "dt-test-suite-exclude=", p->filters[3]);
    parseCommaSepArgs(argc, argv, "dt-tse=",                p->filters[3]);
    parseCommaSepArgs(argc, argv, "dt-test-case=",          p->filters[4]);
    parseCommaSepArgs(argc, argv, "dt-tc=",                 p->filters[4]);
    parseCommaSepArgs(argc, argv, "dt-test-case-exclude=",  p->filters[5]);
    parseCommaSepArgs(argc, argv, "dt-tce=",                p->filters[5]);
    // clang-format on

    int    intRes = 0;
    String strRes;

#define DOCTEST_PARSE_AS_BOOL_OR_FLAG(name, sname, var, default)                                   \
    if(parseIntOption(argc, argv, DOCTEST_STR_CONCAT_TOSTR(name, =), option_bool, intRes) ||       \
       parseIntOption(argc, argv, DOCTEST_STR_CONCAT_TOSTR(sname, =), option_bool, intRes))        \
        p->var = !!intRes;                                                                         \
    else if(parseFlag(argc, argv, #name) || parseFlag(argc, argv, #sname))                         \
        p->var = 1;                                                                                \
    else if(withDefaults)                                                                          \
    p->var = default

#define DOCTEST_PARSE_INT_OPTION(name, sname, var, default)                                        \
    if(parseIntOption(argc, argv, DOCTEST_STR_CONCAT_TOSTR(name, =), option_int, intRes) ||        \
       parseIntOption(argc, argv, DOCTEST_STR_CONCAT_TOSTR(sname, =), option_int, intRes))         \
        p->var = intRes;                                                                           \
    else if(withDefaults)                                                                          \
    p->var = default

#define DOCTEST_PARSE_STR_OPTION(name, sname, var, default)                                        \
    if(parseOption(argc, argv, DOCTEST_STR_CONCAT_TOSTR(name, =), strRes, default) ||              \
       parseOption(argc, argv, DOCTEST_STR_CONCAT_TOSTR(sname, =), strRes, default) ||             \
       withDefaults)                                                                               \
    p->var = strRes

    // clang-format off
    DOCTEST_PARSE_STR_OPTION(dt-order-by, dt-ob, order_by, "file");
    DOCTEST_PARSE_INT_OPTION(dt-rand-seed, dt-rs, rand_seed, 0);

    DOCTEST_PARSE_INT_OPTION(dt-first, dt-f, first, 1);
    DOCTEST_PARSE_INT_OPTION(dt-last, dt-l, last, 0);

    DOCTEST_PARSE_INT_OPTION(dt-abort-after, dt-aa, abort_after, 0);

    DOCTEST_PARSE_AS_BOOL_OR_FLAG(dt-success, dt-s, success, 0);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG(dt-case-sensitive, dt-cs, case_sensitive, 0);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG(dt-exit, dt-e, exit, 0);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG(dt-no-throw, dt-nt, no_throw, 0);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG(dt-no-exitcode, dt-ne, no_exitcode, 0);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG(dt-no-run, dt-nr, no_run, 0);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG(dt-no-version, dt-nv, no_version, 0);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG(dt-no-colors, dt-nc, no_colors, 0);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG(dt-no-breaks, dt-nb, no_breaks, 0);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG(dt-no-path-filenames, dt-npf, no_path_in_filenames, 0);
// clang-format on

#undef DOCTEST_PARSE_STR_OPTION
#undef DOCTEST_PARSE_INT_OPTION
#undef DOCTEST_PARSE_AS_BOOL_OR_FLAG

    if(withDefaults) {
        p->help             = false;
        p->version          = false;
        p->count            = false;
        p->list_test_cases  = false;
        p->list_test_suites = false;
    }
    if(parseFlag(argc, argv, "dt-help") || parseFlag(argc, argv, "dt-h") ||
       parseFlag(argc, argv, "dt-?")) {
        p->help = true;
        p->exit = true;
    }
    if(parseFlag(argc, argv, "dt-version") || parseFlag(argc, argv, "dt-v")) {
        p->version = true;
        p->exit    = true;
    }
    if(parseFlag(argc, argv, "dt-count") || parseFlag(argc, argv, "dt-c")) {
        p->count = true;
        p->exit  = true;
    }
    if(parseFlag(argc, argv, "dt-list-test-cases") || parseFlag(argc, argv, "dt-ltc")) {
        p->list_test_cases = true;
        p->exit            = true;
    }
    if(parseFlag(argc, argv, "dt-list-test-suites") || parseFlag(argc, argv, "dt-lts")) {
        p->list_test_suites = true;
        p->exit             = true;
    }
}